

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_GetSignaturePubkeyList_Test::TestBody(Psbt_GetSignaturePubkeyList_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pk_list;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Psbt psbt2;
  Psbt psbt;
  string *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  int *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  char *in_stack_fffffffffffffcb8;
  Psbt *in_stack_fffffffffffffcd8;
  allocator *paVar5;
  Psbt *this_00;
  AssertHelper local_318;
  Message local_310;
  string local_308;
  AssertionResult local_2e8;
  AssertHelper local_2d8;
  Message local_2d0;
  string local_2c8;
  AssertionResult local_2a8;
  AssertHelper local_298;
  Message local_290;
  size_type local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_268;
  string local_250;
  AssertHelper local_230;
  Message local_228;
  allocator local_219;
  string local_218;
  Pubkey local_1f8;
  byte local_1d9;
  AssertionResult local_1d8;
  string local_1c8;
  AssertHelper local_1a8;
  Message local_1a0;
  allocator local_191;
  string local_190;
  Pubkey local_170;
  undefined1 local_151;
  AssertionResult local_150;
  Psbt local_140;
  undefined1 local_a9 [169];
  
  this_00 = (Psbt *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_a9 + 1),
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
             ,(allocator *)this_00);
  cfd::Psbt::Psbt((Psbt *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                  in_stack_fffffffffffffc98);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  cfd::Psbt::Psbt(this_00,in_stack_fffffffffffffcd8);
  paVar5 = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,
             "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",paVar5);
  cfd::core::Pubkey::Pubkey(&local_170,&local_190);
  local_151 = cfd::core::Psbt::IsFindTxInSignature(&local_140,0,&local_170);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (bool *)in_stack_fffffffffffffc98,(type *)0x2b941b);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b942a);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c8,(internal *)&local_150,
               (AssertionResult *)
               "psbt2.IsFindTxInSignature(0, Pubkey(\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"))"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x59f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    testing::Message::~Message((Message *)0x2b95f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b9674);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,
             "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b48",&local_219);
  cfd::core::Pubkey::Pubkey(&local_1f8,&local_218);
  bVar1 = cfd::core::Psbt::IsFindTxInSignature(&local_140,0,&local_1f8);
  local_1d9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (bool *)in_stack_fffffffffffffc98,(type *)0x2b96fd);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2b970c);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)&local_1d8,
               (AssertionResult *)
               "psbt2.IsFindTxInSignature(0, Pubkey(\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b48\"))"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    testing::Message::~Message((Message *)0x2b988b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b9906);
  cfd::core::Psbt::GetTxInSignaturePubkeyList(&local_268,&local_140,0);
  local_27c = 2;
  local_288 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(&local_268);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            (in_stack_fffffffffffffcb8,
             (char *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
             in_stack_fffffffffffffca8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2b9a07);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message((Message *)0x2b9a64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b9abc);
  sVar3 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size(&local_268);
  if (sVar3 == 2) {
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       (&local_268,0);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_2c8,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2a8,
               "\"03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3\"",
               "pk_list[0].GetHex().c_str()",
               "03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",pcVar2);
    std::__cxx11::string::~string((string *)&local_2c8);
    in_stack_fffffffffffffcb7 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!(bool)in_stack_fffffffffffffcb7) {
      testing::Message::Message(&local_2d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2b9bc6);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5a6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message((Message *)0x2b9c23);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b9c7b);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       (&local_268,1);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_308,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2e8,
               "\"03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47\"",
               "pk_list[1].GetHex().c_str()",
               "03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",pcVar2);
    std::__cxx11::string::~string((string *)&local_308);
    in_stack_fffffffffffffca7 = testing::AssertionResult::operator_cast_to_bool(&local_2e8);
    if (!(bool)in_stack_fffffffffffffca7) {
      testing::Message::Message(&local_310);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x2b9d60);
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x5a8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      testing::Message::~Message((Message *)0x2b9dac);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2b9dfb);
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
             CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  cfd::Psbt::~Psbt((Psbt *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
  return;
}

Assistant:

TEST(Psbt, GetSignaturePubkeyList) {
  Psbt psbt("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==");

  Psbt psbt2(psbt);
  EXPECT_TRUE(psbt2.IsFindTxInSignature(0, Pubkey("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47")));
  EXPECT_FALSE(psbt2.IsFindTxInSignature(0, Pubkey("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b48")));

  auto pk_list = psbt2.GetTxInSignaturePubkeyList(0);
  EXPECT_EQ(2, pk_list.size());
  if (pk_list.size() == 2) {
    EXPECT_STREQ("03a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3",
        pk_list[0].GetHex().c_str());
    EXPECT_STREQ("03f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47",
        pk_list[1].GetHex().c_str());
  }
}